

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O2

uint aom_masked_sad_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,
                        uint8_t *second_pred,uint8_t *msk,int msk_stride,int invert_mask,int m,int n
                        )

{
  uint uVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *b_ptr;
  int iVar4;
  
  if (invert_mask == 0) {
    if (m == 0x10) {
      iVar4 = 0x10;
      puVar3 = ref;
      ref = second_pred;
      iVar2 = ref_stride;
      goto LAB_0030a59a;
    }
    if (m == 8) {
      iVar4 = 8;
      puVar3 = ref;
      ref = second_pred;
      iVar2 = ref_stride;
      goto LAB_0030a581;
    }
    puVar3 = ref;
    b_ptr = second_pred;
    iVar2 = ref_stride;
    iVar4 = m;
    if (m != 4) goto LAB_0030a5ae;
    iVar4 = 4;
    ref = second_pred;
  }
  else {
    if (m == 0x10) {
      puVar3 = second_pred;
      iVar2 = 0x10;
      iVar4 = ref_stride;
LAB_0030a59a:
      uVar1 = masked_sad16xh_avx2(src,src_stride,puVar3,iVar2,ref,iVar4,msk,msk_stride,n);
      return uVar1;
    }
    if (m == 8) {
      puVar3 = second_pred;
      iVar2 = 8;
      iVar4 = ref_stride;
LAB_0030a581:
      uVar1 = aom_masked_sad8xh_ssse3(src,src_stride,puVar3,iVar2,ref,iVar4,msk,msk_stride,n);
      return uVar1;
    }
    puVar3 = second_pred;
    b_ptr = ref;
    iVar2 = m;
    iVar4 = ref_stride;
    if (m != 4) {
LAB_0030a5ae:
      uVar1 = masked_sad32xh_avx2(src,src_stride,puVar3,iVar2,b_ptr,iVar4,msk,msk_stride,m,n);
      return uVar1;
    }
    iVar2 = 4;
  }
  uVar1 = aom_masked_sad4xh_ssse3(src,src_stride,puVar3,iVar2,ref,iVar4,msk,msk_stride,n);
  return uVar1;
}

Assistant:

static inline unsigned int aom_masked_sad_avx2(
    const uint8_t *src, int src_stride, const uint8_t *ref, int ref_stride,
    const uint8_t *second_pred, const uint8_t *msk, int msk_stride,
    int invert_mask, int m, int n) {
  unsigned int sad;
  if (!invert_mask) {
    switch (m) {
      case 4:
        sad = aom_masked_sad4xh_ssse3(src, src_stride, ref, ref_stride,
                                      second_pred, m, msk, msk_stride, n);
        break;
      case 8:
        sad = aom_masked_sad8xh_ssse3(src, src_stride, ref, ref_stride,
                                      second_pred, m, msk, msk_stride, n);
        break;
      case 16:
        sad = masked_sad16xh_avx2(src, src_stride, ref, ref_stride, second_pred,
                                  m, msk, msk_stride, n);
        break;
      default:
        sad = masked_sad32xh_avx2(src, src_stride, ref, ref_stride, second_pred,
                                  m, msk, msk_stride, m, n);
        break;
    }
  } else {
    switch (m) {
      case 4:
        sad = aom_masked_sad4xh_ssse3(src, src_stride, second_pred, m, ref,
                                      ref_stride, msk, msk_stride, n);
        break;
      case 8:
        sad = aom_masked_sad8xh_ssse3(src, src_stride, second_pred, m, ref,
                                      ref_stride, msk, msk_stride, n);
        break;
      case 16:
        sad = masked_sad16xh_avx2(src, src_stride, second_pred, m, ref,
                                  ref_stride, msk, msk_stride, n);
        break;
      default:
        sad = masked_sad32xh_avx2(src, src_stride, second_pred, m, ref,
                                  ref_stride, msk, msk_stride, m, n);
        break;
    }
  }
  return sad;
}